

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

void test_string_traits(void)

{
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  bool bVar4;
  undefined1 local_d0 [8];
  opt_str os_;
  undefined2 local_a0;
  undefined1 local_9e;
  undefined1 *local_90;
  pointer local_88;
  undefined1 local_80 [8];
  size_type sStack_78;
  undefined1 local_70 [8];
  opt_str os0;
  opt_str osA;
  
  psVar3 = &os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x2;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  local_a0 = 0;
  local_9e = 0;
  psVar1 = &osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  local_d0 = (undefined1  [8])psVar3;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ =
       &stack0xffffffffffffff60;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2 +
             8),"");
  psVar2 = &os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  local_70._0_5_ = SUB85(psVar2,0);
  local_70._5_3_ = (undefined3)((ulong)psVar2 >> 0x28);
  if ((size_type *)
      os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ == psVar1)
  {
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._0_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
         _M_allocated_capacity._0_4_;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._4_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
         _M_allocated_capacity._4_4_;
  }
  else {
    local_70._0_5_ =
         (undefined5)
         os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_;
    local_70._5_3_ =
         (undefined3)
         ((ulong)os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_
         >> 0x28);
  }
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p._0_5_ =
       SUB85(osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p,
             0);
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p._5_3_ =
       (undefined3)
       ((ulong)osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus.
               _M_p >> 0x28);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"A","");
  if (local_90 == local_80) {
    osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity = sStack_78;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar1;
  }
  else {
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = local_90;
  }
  osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p = local_88;
  bVar4 = string_empty_value::is_empty_value((string *)local_d0);
  if (!bVar4) {
    __assert_fail("!os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x40,"void test_string_traits()");
  }
  bVar4 = string_empty_value::is_empty_value
                    ((string *)
                     ((long)&os_.super_compact_optional_base<string_empty_value>.super_type.value_.
                             field_2 + 8));
  if (!bVar4) {
    __assert_fail("!os00.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x41,"void test_string_traits()");
  }
  bVar4 = string_empty_value::is_empty_value((string *)local_70);
  if (!bVar4) {
    bVar4 = string_empty_value::is_empty_value
                      ((string *)
                       ((long)&os0.super_compact_optional_base<string_empty_value>.super_type.value_
                               .field_2 + 8));
    if (!bVar4) {
      if ((size_type *)
          os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ !=
          psVar1) {
        operator_delete((void *)os0.super_compact_optional_base<string_empty_value>.super_type.
                                value_.field_2._8_8_);
      }
      if ((size_type *)CONCAT35(local_70._5_3_,local_70._0_5_) != psVar2) {
        operator_delete((undefined1 *)CONCAT35(local_70._5_3_,local_70._0_5_));
      }
      if ((undefined2 *)
          os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ !=
          &stack0xffffffffffffff60) {
        operator_delete((void *)os_.super_compact_optional_base<string_empty_value>.super_type.
                                value_.field_2._8_8_);
      }
      if (local_d0 != (undefined1  [8])psVar3) {
        operator_delete((void *)local_d0);
      }
      return;
    }
    __assert_fail("osA.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x43,"void test_string_traits()");
  }
  __assert_fail("os0.has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x42,"void test_string_traits()");
}

Assistant:

void test_string_traits()
{
  typedef compact_optional<string_empty_value, class tag_X> opt_str;
  static_assert (sizeof(opt_str) == sizeof(std::string), "size waste");
  
  opt_str os_, os00(std::string("\0\0", 2)), os0(std::string("\0")), osA(std::string("A"));
  assert (!os_.has_value());
  assert (!os00.has_value());
  assert ( os0.has_value());
  assert ( osA.has_value());
}